

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Diag
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar2;
  undefined4 extraout_var_01;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  TFad<6,_double> pivot;
  undefined **local_f0;
  double local_e8;
  double local_b0 [9];
  double local_68;
  double adStack_60 [6];
  
  lVar4 = (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar4 != CONCAT44(extraout_var,iVar1)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar4 = 0;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (local_b0 + 8,this,lVar4,lVar4);
      if (0 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol) {
        lVar3 = 0;
        do {
          (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_b0,B,lVar4,lVar3);
          local_f0 = &PTR__TFad_0185d2b8;
          local_e8 = local_b0[1] / local_68;
          lVar2 = 2;
          do {
            auVar5._0_8_ = local_b0[lVar2] * local_68 - local_b0[lVar2 + 8] * local_b0[1];
            auVar5._8_8_ = local_b0[lVar2 + 1] * local_68 - local_b0[lVar2 + 9] * local_b0[1];
            auVar6._8_8_ = local_68 * local_68;
            auVar6._0_8_ = local_68 * local_68;
            auVar6 = divpd(auVar5,auVar6);
            *(undefined1 (*) [16])(&local_f0 + lVar2) = auVar6;
            lVar2 = lVar2 + 2;
          } while (lVar2 != 8);
          (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar4,lVar3,&local_f0);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar4 = lVar4 + 1;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    } while (lVar4 < CONCAT44(extraout_var_01,iVar1));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}